

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

void __thiscall SpriteBase::SpriteBase(SpriteBase *this,PSprite *base)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PSprite *base_local;
  SpriteBase *this_local;
  
  Data::Sprite::Sprite(&this->super_Sprite);
  (this->super_Sprite)._vptr_Sprite = (_func_int **)&PTR_get_data_001a5820;
  peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )base);
  iVar1 = (*peVar3->_vptr_Sprite[3])();
  this->delta_x = iVar1;
  peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )base);
  iVar1 = (*peVar3->_vptr_Sprite[4])();
  this->delta_y = iVar1;
  peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )base);
  iVar1 = (*peVar3->_vptr_Sprite[5])();
  this->offset_x = iVar1;
  peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )base);
  iVar1 = (*peVar3->_vptr_Sprite[6])();
  this->offset_y = iVar1;
  this->data = (uint8_t *)0x0;
  peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )base);
  iVar1 = (*peVar3->_vptr_Sprite[1])();
  peVar3 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )base);
  iVar2 = (*peVar3->_vptr_Sprite[2])();
  create(this,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  return;
}

Assistant:

SpriteBase::SpriteBase(Data::PSprite base)
  : delta_x(base->get_delta_x())
  , delta_y(base->get_delta_y())
  , offset_x(base->get_offset_x())
  , offset_y(base->get_offset_y())
  , data(nullptr) {
  create(base->get_width(), base->get_height());
}